

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O2

void printSolutions(vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  pointer ppsVar1;
  pointer pvVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  pointer ppsVar6;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"\nPrinting Solution: \n");
  std::endl<char,std::char_traits<char>>(poVar3);
  ppsVar1 = (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (ppsVar6 = (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppsVar6 != ppsVar1; ppsVar6 = ppsVar6 + 1
      ) {
    iVar4 = (*ppsVar6)->row + -1;
    iVar5 = iVar4 % 9 + 1;
    if (iVar5 == 0) {
      iVar5 = 9;
    }
    *(int *)(*(long *)&pvVar2[iVar4 / 0x51].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data +
            (long)(int)((long)((ulong)(uint)((int)((long)iVar4 / 9) >> 0x1f) << 0x20 |
                              (long)iVar4 / 9 & 0xffffffffU) % 9) * 4) = iVar5;
  }
  return;
}

Assistant:

void printSolutions(vector<DancingNode*> &solutions, vector<vector<int>> &grid) 
{ 
    
    cout<<"\nPrinting Solution: \n"<< endl;
    vector<DancingNode*>::iterator i; 
  
    for(i = solutions.begin(); i!=solutions.end(); i++){
        //cout<<(*i)->row<<endl;
        int coverRow = (*i)->row - 1;
        int r = coverRow / 81 ;
        int c = (coverRow / 9 ) % 9;
        int answer = (coverRow % 9) + 1;
        if(answer == 0){
            answer = 9;
        }
        
        grid[r][c] = answer;
    }
}